

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ESOINN.cpp
# Opt level: O0

bool __thiscall soinn::ESOINN::needAddEdge(ESOINN *this,Vertex *firstWinner,Vertex *secondWinner)

{
  int iVar1;
  bool bVar2;
  vertex_bundled *pvVar3;
  Vertex *secondWinner_local;
  Vertex *firstWinner_local;
  ESOINN *this_local;
  
  pvVar3 = boost::
           adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>
           ::operator[](&this->graph,*firstWinner);
  if ((pvVar3->classId == -1) ||
     (pvVar3 = boost::
               adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>
               ::operator[](&this->graph,*secondWinner), pvVar3->classId == -1)) {
    this_local._7_1_ = true;
  }
  else {
    pvVar3 = boost::
             adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>
             ::operator[](&this->graph,*firstWinner);
    iVar1 = pvVar3->classId;
    pvVar3 = boost::
             adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>
             ::operator[](&this->graph,*secondWinner);
    if (iVar1 == pvVar3->classId) {
      this_local._7_1_ = true;
    }
    else {
      pvVar3 = boost::
               adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>
               ::operator[](&this->graph,*firstWinner);
      iVar1 = pvVar3->classId;
      pvVar3 = boost::
               adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>
               ::operator[](&this->graph,*secondWinner);
      if ((iVar1 == pvVar3->classId) ||
         (bVar2 = needMergeClasses(this,firstWinner,secondWinner), !bVar2)) {
        this_local._7_1_ = false;
      }
      else {
        this_local._7_1_ = true;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ESOINN::needAddEdge(Vertex& firstWinner, Vertex &secondWinner)
{
    if(graph[firstWinner].classId == -1 || graph[secondWinner].classId == -1)
    {
        return true;
    }
    else if(graph[firstWinner].classId == graph[secondWinner].classId)
    {
        return true;
    }
    else if(graph[firstWinner].classId != graph[secondWinner].classId && needMergeClasses(firstWinner, secondWinner))
    {
        return true;
    }
    return false;
}